

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall Js::FunctionProxy::HasValidNonProfileEntryPoint(FunctionProxy *this)

{
  JavascriptMethod codeAddress;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  JavascriptMethod p_Var6;
  FunctionInfo *this_00;
  
  this_00 = (this->functionInfo).ptr;
  codeAddress = (JavascriptMethod)((this->m_defaultEntryPointInfo).ptr)->jsMethod;
  if (this_00 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dc,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00764f74;
    *puVar5 = 0;
    this_00 = (this->functionInfo).ptr;
  }
  if ((this_00->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4dd,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_00764f74;
    *puVar5 = 0;
    this_00 = (this->functionInfo).ptr;
  }
  p_Var6 = FunctionInfo::GetOriginalEntryPoint_Unchecked(this_00);
  bVar2 = IsFunctionBody(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar2) {
LAB_00764f74:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  if ((*(ushort *)&this->field_0x45 >> 10 & 1) != 0) {
    if (((*(ushort *)&this->field_0x45 >> 0xb & 1) != 0) &&
       (uVar4 = FunctionBody::GetCountField((FunctionBody *)this,ByteCodeCount), uVar4 == 0)) {
      return codeAddress == WasmLibrary::WasmLazyTrapCallback ||
             codeAddress == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk;
    }
    if (codeAddress == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk) {
      return true;
    }
    BVar3 = IsAsmJsCodeGenThunk(codeAddress);
    if (BVar3 != 0) {
      return true;
    }
  }
  BVar3 = IsIntermediateCodeGenThunk(codeAddress);
  bVar2 = true;
  if ((BVar3 == 0) && (p_Var6 != codeAddress)) {
    if (codeAddress == DynamicProfileInfo::EnsureDynamicProfileInfoThunk) {
      BVar3 = FunctionBody::IsNativeOriginalEntryPoint((FunctionBody *)this);
      bVar2 = BVar3 != 0;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool FunctionProxy::HasValidNonProfileEntryPoint() const
    {
        JavascriptMethod directEntryPoint = this->GetDefaultEntryPointInfo()->jsMethod;
        JavascriptMethod originalEntryPoint = this->GetOriginalEntryPoint_Unchecked();

        FunctionBody* body = this->GetFunctionBody();
        Unused(body); // in some configuration
#ifdef ASMJS_PLAT
        if (body->GetIsAsmJsFunction())
        {
#ifdef ENABLE_WASM
            if (body->IsWasmFunction() && body->GetByteCodeCount() == 0)
            {
                // The only valid 2 entrypoints if the function hasn't been parsed
                return directEntryPoint == AsmJsDefaultEntryThunk || directEntryPoint == WasmLibrary::WasmLazyTrapCallback;
            }
#endif
            // Entrypoints valid only for asm.js/wasm
            if (directEntryPoint == AsmJsDefaultEntryThunk || IsAsmJsCodeGenThunk(directEntryPoint))
            {
                return true;
            }
        }
#endif
        // Check the direct entry point to see if it is codegen thunk
        // if it is not, the background codegen thread has updated both original entry point and direct entry point
        // and they should still match, same as cases other then code gen
        return IsIntermediateCodeGenThunk(directEntryPoint) || originalEntryPoint == directEntryPoint
#if ENABLE_PROFILE_INFO
            || (directEntryPoint == DynamicProfileInfo::EnsureDynamicProfileInfoThunk && body->IsNativeOriginalEntryPoint())
#endif
            ;
    }